

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

void reset_monsters(void)

{
  wchar_t wVar1;
  monster *pmVar2;
  uint uVar3;
  
  wVar1 = cave_monster_max(cave);
  if (L'\x01' < wVar1) {
    uVar3 = wVar1 + L'\x01';
    do {
      pmVar2 = cave_monster(cave,uVar3 + L'\xfffffffe');
      flag_off(pmVar2->mflag,2,9);
      uVar3 = uVar3 - 1;
    } while (2 < uVar3);
  }
  return;
}

Assistant:

void reset_monsters(void)
{
	int i;
	struct monster *mon;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Monster is ready to go again */
		mflag_off(mon->mflag, MFLAG_HANDLED);
	}
}